

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
wallet::anon_unknown_5::WalletImpl::tryGetBalances
          (WalletImpl *this,WalletBalances *balances,uint256 *block_hash)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> locked_wallet;
  uint256 local_68;
  CAmount local_48;
  CAmount CStack_40;
  CAmount local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&locked_wallet,
             &((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->cs_wallet,"m_wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/interfaces.cpp"
             ,0x1a4,true);
  if (locked_wallet.super_unique_lock._M_owns == true) {
    CWallet::GetLastBlockHash
              (&local_68,
               (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x10) =
         local_68.super_base_blob<256U>.m_data._M_elems._16_4_;
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x14) =
         local_68.super_base_blob<256U>.m_data._M_elems._20_4_;
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x18) =
         local_68.super_base_blob<256U>.m_data._M_elems._24_4_;
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x1c) =
         local_68.super_base_blob<256U>.m_data._M_elems._28_4_;
    *(undefined4 *)(block_hash->super_base_blob<256U>).m_data._M_elems =
         local_68.super_base_blob<256U>.m_data._M_elems._0_4_;
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 4) =
         local_68.super_base_blob<256U>.m_data._M_elems._4_4_;
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 8) =
         local_68.super_base_blob<256U>.m_data._M_elems._8_4_;
    *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0xc) =
         local_68.super_base_blob<256U>.m_data._M_elems._12_4_;
    (*(this->super_Wallet)._vptr_Wallet[0x29])(&local_68,this);
    balances->immature_watch_only_balance = local_38;
    balances->watch_only_balance = local_48;
    balances->unconfirmed_watch_only_balance = CStack_40;
    balances->immature_balance =
         CONCAT44(local_68.super_base_blob<256U>.m_data._M_elems._20_4_,
                  local_68.super_base_blob<256U>.m_data._M_elems._16_4_);
    *(ulong *)&balances->have_watch_only =
         CONCAT44(local_68.super_base_blob<256U>.m_data._M_elems._28_4_,
                  local_68.super_base_blob<256U>.m_data._M_elems._24_4_);
    balances->balance =
         CONCAT44(local_68.super_base_blob<256U>.m_data._M_elems._4_4_,
                  local_68.super_base_blob<256U>.m_data._M_elems._0_4_);
    balances->unconfirmed_balance =
         CONCAT44(local_68.super_base_blob<256U>.m_data._M_elems._12_4_,
                  local_68.super_base_blob<256U>.m_data._M_elems._8_4_);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&locked_wallet.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return locked_wallet.super_unique_lock._M_owns;
  }
  __stack_chk_fail();
}

Assistant:

bool tryGetBalances(WalletBalances& balances, uint256& block_hash) override
    {
        TRY_LOCK(m_wallet->cs_wallet, locked_wallet);
        if (!locked_wallet) {
            return false;
        }
        block_hash = m_wallet->GetLastBlockHash();
        balances = getBalances();
        return true;
    }